

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

void HUF_sort(nodeElt *huffNode,uint *count,U32 maxSymbolValue,rankPos *rankPosition)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint local_40;
  U32 pos;
  U32 r;
  U32 c;
  U32 lowerRank;
  int maxSymbolValue1;
  int n;
  rankPos *rankPosition_local;
  U32 maxSymbolValue_local;
  uint *count_local;
  nodeElt *huffNode_local;
  
  memset(rankPosition,0,0x100);
  for (lowerRank = 0; (int)lowerRank < (int)(maxSymbolValue + 1); lowerRank = lowerRank + 1) {
    uVar2 = BIT_highbit32(count[(int)lowerRank] + 1);
    rankPosition[uVar2].base = rankPosition[uVar2].base + 1;
  }
  for (lowerRank = 0x1f; 0 < (int)lowerRank; lowerRank = lowerRank - 1) {
    rankPosition[(int)(lowerRank - 1)].base =
         rankPosition[(int)lowerRank].base + rankPosition[(int)(lowerRank - 1)].base;
    rankPosition[(int)(lowerRank - 1)].curr = rankPosition[(int)(lowerRank - 1)].base;
  }
  for (lowerRank = 0; (int)lowerRank < (int)(maxSymbolValue + 1); lowerRank = lowerRank + 1) {
    uVar2 = count[(int)lowerRank];
    uVar3 = BIT_highbit32(uVar2 + 1);
    uVar3 = uVar3 + 1;
    local_40 = rankPosition[uVar3].curr;
    rankPosition[uVar3].curr = local_40 + 1;
    while( true ) {
      bVar1 = false;
      if (rankPosition[uVar3].base < local_40) {
        bVar1 = huffNode[local_40 - 1].count < uVar2;
      }
      if (!bVar1) break;
      huffNode[local_40] = huffNode[local_40 - 1];
      local_40 = local_40 - 1;
    }
    huffNode[local_40].count = uVar2;
    huffNode[local_40].byte = (BYTE)lowerRank;
  }
  return;
}

Assistant:

static void HUF_sort(nodeElt* huffNode, const unsigned* count, U32 maxSymbolValue, rankPos* rankPosition)
{
    int n;
    int const maxSymbolValue1 = (int)maxSymbolValue + 1;

    /* Compute base and set curr to base.
     * For symbol s let lowerRank = BIT_highbit32(count[n]+1) and rank = lowerRank + 1.
     * Then 2^lowerRank <= count[n]+1 <= 2^rank.
     * We attribute each symbol to lowerRank's base value, because we want to know where
     * each rank begins in the output, so for rank R we want to count ranks R+1 and above.
     */
    ZSTD_memset(rankPosition, 0, sizeof(*rankPosition) * RANK_POSITION_TABLE_SIZE);
    for (n = 0; n < maxSymbolValue1; ++n) {
        U32 lowerRank = BIT_highbit32(count[n] + 1);
        rankPosition[lowerRank].base++;
    }
    assert(rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0);
    for (n = RANK_POSITION_TABLE_SIZE - 1; n > 0; --n) {
        rankPosition[n-1].base += rankPosition[n].base;
        rankPosition[n-1].curr = rankPosition[n-1].base;
    }
    /* Sort */
    for (n = 0; n < maxSymbolValue1; ++n) {
        U32 const c = count[n];
        U32 const r = BIT_highbit32(c+1) + 1;
        U32 pos = rankPosition[r].curr++;
        /* Insert into the correct position in the rank.
         * We have at most 256 symbols, so this insertion should be fine.
         */
        while ((pos > rankPosition[r].base) && (c > huffNode[pos-1].count)) {
            huffNode[pos] = huffNode[pos-1];
            pos--;
        }
        huffNode[pos].count = c;
        huffNode[pos].byte  = (BYTE)n;
    }
}